

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_maps.cpp
# Opt level: O2

bool polyscope::render::buildColormapSelector(string *cm,string *fieldName)

{
  undefined8 *puVar1;
  char *label;
  bool bVar2;
  __type selected;
  ImVec2 in_RAX;
  bool bVar3;
  unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>
  *c;
  undefined8 *puVar4;
  ImVec2 local_38;
  
  local_38 = in_RAX;
  ImGui::PushItemWidth(100.0);
  bVar3 = false;
  bVar2 = ImGui::BeginCombo((fieldName->_M_dataplus)._M_p,(cm->_M_dataplus)._M_p,0);
  if (bVar2) {
    bVar3 = false;
    puVar1 = *(undefined8 **)(engine + 0x210);
    for (puVar4 = *(undefined8 **)(engine + 0x208); puVar4 != puVar1; puVar4 = puVar4 + 1) {
      label = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar4)->
              _M_dataplus)._M_p;
      selected = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)*puVar4,cm);
      local_38.x = 0.0;
      local_38.y = 0.0;
      bVar2 = ImGui::Selectable(label,selected,0,&local_38);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)cm);
        bVar3 = true;
      }
    }
    ImGui::EndCombo();
  }
  ImGui::PopItemWidth();
  return bVar3;
}

Assistant:

bool buildColormapSelector(std::string& cm, std::string fieldName) {
  bool changed = false;

  ImGui::PushItemWidth(100);

  if (ImGui::BeginCombo(fieldName.c_str(), cm.c_str())) {
    for (auto& c : render::engine->colorMaps) {
      if (ImGui::Selectable(c->name.c_str(), c->name == cm)) {
        changed = true;
        cm = c->name;
      }
    }
    ImGui::EndCombo();
  }

  ImGui::PopItemWidth();

  return changed;
}